

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
FindNextProperty(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>
                 *this,ScriptContext *scriptContext,PropertyIndex *index,
                JavascriptString **propertyStringName,PropertyId *propertyId,
                PropertyAttributes *attributes,Type *type,DynamicType *typeToEnumerate,
                EnumeratorFlags flags,DynamicObject *instance,PropertyValueInfo *info)

{
  SimpleDictionaryPropertyDescriptor<unsigned_short> SVar1;
  DynamicTypeHandler *pDVar2;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  PropertyRecord *key;
  code *pcVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  PropertyId propertyId_00;
  undefined4 *puVar7;
  ScriptContext *this_01;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar8;
  PropertyRecord **ppPVar9;
  PropertyString *this_02;
  PolymorphicInlineCache *polymorphicInlineCache;
  PropertyRecord *local_50;
  SimpleDictionaryPropertyDescriptor<unsigned_short> descriptor;
  SimpleDictionaryPropertyDescriptor<unsigned_short> local_3c;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *pSStack_38;
  SimpleDictionaryPropertyDescriptor<unsigned_short> descriptor_1;
  
  _descriptor = propertyStringName;
  pSStack_38 = this;
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x271,"(propertyStringName)","propertyStringName");
    if (!bVar4) goto LAB_00c5a93f;
    *puVar7 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x272,"(propertyId)","propertyId");
    if (!bVar4) goto LAB_00c5a93f;
    *puVar7 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x273,"(type)","type");
    if (!bVar4) goto LAB_00c5a93f;
    *puVar7 = 0;
  }
  if (typeToEnumerate == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x274,"(typeToEnumerate)","typeToEnumerate");
    if (!bVar4) {
LAB_00c5a93f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  if ((DynamicType *)type == typeToEnumerate) {
    uVar5 = *index;
    while (this_00 = (pSStack_38->propertyMap).ptr,
          (int)(uint)uVar5 < this_00->count - this_00->freeCount) {
      pSVar8 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(this_00,(uint)uVar5);
      SVar1 = *pSVar8;
      local_50 = (PropertyRecord *)CONCAT44(local_50._4_4_,SVar1);
      if ((((uint)SVar1 >> 8 & 0x18) == 0) &&
         (((SVar1.Attributes | flags) & EnumNonEnumerable) != None)) {
        ppPVar9 = JsUtil::
                  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                  ::GetKeyAt((pSStack_38->propertyMap).ptr,(uint)*index);
        key = *ppPVar9;
        if (((flags & EnumSymbols) != None) || (key->isSymbol == false)) {
          if (attributes != (PropertyAttributes *)0x0) {
            *attributes = SVar1.Attributes;
          }
          propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,key);
          *propertyId = propertyId_00;
          this_02 = ScriptContext::GetPropertyString(scriptContext,propertyId_00);
          *_descriptor = &this_02->super_JavascriptString;
          if (((uint)SVar1 >> 8 & 4) == 0) {
            if (info == (PropertyValueInfo *)0x0) {
              return 1;
            }
            info->m_instance = &instance->super_RecyclableObject;
            info->m_propertyIndex = 0xffff;
            info->m_attributes = '\0';
            info->flags = InlineCacheNoFlags;
            return 1;
          }
          polymorphicInlineCache = PropertyString::GetLdElemInlineCache(this_02);
          PropertyValueInfo::SetCacheInfo<Js::PropertyString>
                    (info,this_02,polymorphicInlineCache,false);
          SetPropertyValueInfo
                    (pSStack_38,info,&instance->super_RecyclableObject,
                     (SimpleDictionaryPropertyDescriptor<unsigned_short> *)&local_50);
          return 1;
        }
      }
      uVar5 = *index + 1;
      *index = uVar5;
    }
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
  }
  else {
    pDVar2 = (typeToEnumerate->typeHandler).ptr;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while (iVar6 = (*pDVar2->_vptr_DynamicTypeHandler[10])
                             (pDVar2,scriptContext,index,_descriptor,propertyId,attributes,
                              typeToEnumerate,typeToEnumerate,(ulong)flags,instance,info),
          iVar6 != 0) {
      local_3c._0_1_ = 1;
      local_3c.Attributes = '\a';
      local_3c.propertyIndex = 0xffff;
      if (*propertyId == -1) {
        if (*_descriptor != (JavascriptString *)0x0) {
          bVar4 = JsUtil::
                  BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                  ::TryGetValue<Js::JavascriptString*>
                            ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                              *)(pSStack_38->propertyMap).ptr,_descriptor,&local_3c);
          goto LAB_00c5a7cb;
        }
      }
      else {
        this_01 = Js::Type::GetScriptContext(type);
        local_50 = ScriptContext::GetPropertyName(this_01,*propertyId);
        if (((flags & EnumSymbols) == None) && (local_50->isSymbol == true)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x2b7,
                                      "(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol())"
                                      ,
                                      "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols"
                                     );
          if (!bVar4) goto LAB_00c5a93f;
          *puVar7 = 0;
        }
        bVar4 = JsUtil::
                BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                ::TryGetValue<Js::PropertyRecord_const*>
                          ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                            *)(pSStack_38->propertyMap).ptr,&local_50,&local_3c);
LAB_00c5a7cb:
        if (((bVar4 != false) && (((uint)local_3c & 0x1800) == 0)) &&
           (((local_3c.Attributes | flags) & EnumNonEnumerable) != None)) {
          if (attributes != (PropertyAttributes *)0x0) {
            *attributes = local_3c.Attributes;
          }
          if (info != (PropertyValueInfo *)0x0) {
            info->m_instance = &instance->super_RecyclableObject;
            info->m_propertyIndex = 0xffff;
            info->m_attributes = '\0';
            info->flags = InlineCacheNoFlags;
          }
          return 1;
        }
      }
      *index = *index + 1;
    }
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
  }
  return 0;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FindNextProperty(ScriptContext* scriptContext, PropertyIndex& index, JavascriptString** propertyStringName,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);
        Assert(typeToEnumerate);

        if(type == typeToEnumerate)
        {
            for( ; index < propertyMap->Count(); ++index )
            {
                SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyMap->GetValueAt(index));
                if( !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (descriptor.Attributes & PropertyEnumerable)))
                {
                    TMapKey key = propertyMap->GetKeyAt(index);

                    // Skip this property if it is a symbol and we are not including symbol properties
                    if (!(flags & EnumeratorFlags::EnumSymbols) && TMapKey_IsSymbol(key, scriptContext))
                    {
                        continue;
                    }

                    if (attributes != nullptr)
                    {
                        *attributes = descriptor.Attributes;
                    }

                    *propertyId = TMapKey_GetPropertyId(scriptContext, key);
                    PropertyString* propertyString = scriptContext->GetPropertyString(*propertyId);
                    *propertyStringName = propertyString;
                    if (descriptor.Attributes & PropertyWritable)
                    {
                        PropertyValueInfo::SetCacheInfo(info, propertyString, propertyString->GetLdElemInlineCache(), false);
                        SetPropertyValueInfo(info, instance, &descriptor);
                    }
                    else
                    {
                        PropertyValueInfo::SetNoCache(info, instance);
                    }
                    return TRUE;
                }
            }
            PropertyValueInfo::SetNoCache(info, instance);

            return FALSE;
        }

        // Need to enumerate a different type than the current one. This is because type snapshot enumerate is enabled and the
        // object's type changed since enumeration began, so need to enumerate properties of the initial type.
        DynamicTypeHandler *const typeHandlerToEnumerate = typeToEnumerate->GetTypeHandler();
        for(
            ;
            typeHandlerToEnumerate->FindNextProperty(
                scriptContext,
                index,
                propertyStringName,
                propertyId,
                attributes,
                typeToEnumerate,
                typeToEnumerate,
                flags,
                instance,
                info);
            ++index)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor;
            bool hasValue = false;
            if (*propertyId != Constants::NoProperty)
            {
                PropertyRecord const* propertyRecord = type->GetScriptContext()->GetPropertyName(*propertyId);

                AssertMsg(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol(),
                    "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols");

                hasValue = propertyMap->TryGetValue(propertyRecord, &descriptor);
            }
            else if (*propertyStringName != nullptr)
            {
                hasValue = propertyMap->TryGetValue(*propertyStringName, &descriptor);
            }

            if (hasValue &&
                !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) &&
                (!!(flags & EnumeratorFlags::EnumNonEnumerable) || descriptor.Attributes & PropertyEnumerable))
            {
                if (attributes != nullptr)
                {
                    *attributes = descriptor.Attributes;
                }
                PropertyValueInfo::SetNoCache(info, instance);
                return TRUE;
            }
        }
        PropertyValueInfo::SetNoCache(info, instance);

        return FALSE;
    }